

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_mgau.c
# Opt level: O3

int32 ms_cont_mgau_frame_eval
                (ps_mgau_t *mg,int16 *senscr,uint8 *senone_active,int32 n_senone_active,
                mfcc_t **feat,int32 frame,int32 compallsen)

{
  int32 n_top;
  gauden_t *g;
  senone_t *s;
  short sVar1;
  int32 iVar2;
  ulong uVar3;
  int iVar4;
  int16 iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  
  n_top = *(int32 *)&mg[2].vt;
  g = (gauden_t *)mg[1].vt;
  s = *(senone_t **)&mg[1].frame_idx;
  uVar7 = g->n_mgau;
  uVar8 = (ulong)uVar7;
  if (compallsen == 0) {
    if (0 < (int)uVar7) {
      lVar9 = 0;
      do {
        *(undefined1 *)((long)&(mg[3].vt)->name + lVar9) = 0;
        lVar9 = lVar9 + 1;
        uVar8 = (ulong)g->n_mgau;
      } while (lVar9 < (long)uVar8);
    }
    uVar3 = (ulong)(uint)n_senone_active;
    if (0 < n_senone_active) {
      uVar8 = 0;
      uVar10 = 0;
      do {
        uVar10 = (ulong)((int)uVar10 + (uint)senone_active[uVar8]);
        *(undefined1 *)((long)&(mg[3].vt)->name + (ulong)s->mgau[uVar10]) = 1;
        uVar8 = uVar8 + 1;
      } while (uVar3 != uVar8);
      uVar8 = (ulong)(uint)g->n_mgau;
    }
    if (0 < (int)uVar8) {
      lVar9 = 0;
      do {
        if (*(char *)((long)&(mg[3].vt)->name + lVar9) != '\0') {
          gauden_dist(g,(int)lVar9,n_top,feat,
                      *(gauden_dist_t ***)(*(long *)&mg[2].frame_idx + lVar9 * 8));
          uVar8 = (ulong)(uint)g->n_mgau;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < (int)uVar8);
    }
    if (0 < n_senone_active) {
      uVar10 = 0;
      uVar8 = 0;
      iVar4 = 0x7fffffff;
      do {
        uVar7 = (int)uVar8 + (uint)senone_active[uVar10];
        uVar8 = (ulong)uVar7;
        iVar2 = senone_eval(s,uVar7,*(gauden_dist_t ***)
                                     (*(long *)&mg[2].frame_idx + (ulong)s->mgau[uVar8] * 8),n_top);
        sVar1 = (short)iVar2;
        senscr[uVar8] = sVar1;
        iVar6 = (int)sVar1;
        if (iVar4 < sVar1) {
          iVar6 = iVar4;
        }
        uVar10 = uVar10 + 1;
        iVar4 = iVar6;
      } while (uVar3 != uVar10);
      if (0 < n_senone_active) {
        uVar8 = 0;
        uVar10 = 0;
        do {
          uVar10 = (ulong)((uint)senone_active[uVar8] + (int)uVar10);
          iVar4 = senscr[uVar10] - iVar6;
          if (0x7ffe < iVar4) {
            iVar4 = 0x7fff;
          }
          if (iVar4 < -0x7fff) {
            iVar4 = -0x8000;
          }
          senscr[uVar10] = (int16)iVar4;
          uVar8 = uVar8 + 1;
        } while (uVar3 != uVar8);
      }
    }
  }
  else {
    if (0 < (int)uVar7) {
      lVar9 = 0;
      do {
        gauden_dist(g,(int)lVar9,n_top,feat,
                    *(gauden_dist_t ***)(*(long *)&mg[2].frame_idx + lVar9 * 8));
        lVar9 = lVar9 + 1;
      } while (lVar9 < g->n_mgau);
    }
    if (s->n_sen != 0) {
      iVar4 = 0x7fffffff;
      uVar8 = 0;
      do {
        iVar2 = senone_eval(s,(int)uVar8,
                            *(gauden_dist_t ***)
                             (*(long *)&mg[2].frame_idx + (ulong)s->mgau[uVar8] * 8),n_top);
        sVar1 = (short)iVar2;
        iVar6 = (int)sVar1;
        if (iVar4 < sVar1) {
          iVar6 = iVar4;
        }
        iVar4 = iVar6;
        senscr[uVar8] = sVar1;
        uVar8 = uVar8 + 1;
        uVar3 = (ulong)s->n_sen;
      } while (uVar8 < uVar3);
      if (uVar3 != 0) {
        uVar8 = 0;
        do {
          iVar6 = senscr[uVar8] - iVar4;
          if (0x7ffe < iVar6) {
            iVar6 = 0x7fff;
          }
          iVar5 = (int16)iVar6;
          if (iVar6 < -0x7fff) {
            iVar5 = -0x8000;
          }
          senscr[uVar8] = iVar5;
          uVar8 = uVar8 + 1;
        } while (uVar3 != uVar8);
      }
    }
  }
  return 0;
}

Assistant:

int32
ms_cont_mgau_frame_eval(ps_mgau_t * mg,
			int16 *senscr,
			uint8 *senone_active,
			int32 n_senone_active,
                        mfcc_t ** feat,
			int32 frame,
			int32 compallsen)
{
    ms_mgau_model_t *msg = (ms_mgau_model_t *)mg;
    int32 gid;
    int32 topn;
    int32 best;
    gauden_t *g;
    senone_t *sen;

    (void)frame;
    topn = ms_mgau_topn(msg);
    g = ms_mgau_gauden(msg);
    sen = ms_mgau_senone(msg);

    if (compallsen) {
	int32 s;

	for (gid = 0; gid < g->n_mgau; gid++)
	    gauden_dist(g, gid, topn, feat, msg->dist[gid]);

	best = MAX_INT32;
	for (s = 0; (uint32)s < sen->n_sen; s++) {
	    senscr[s] = senone_eval(sen, s, msg->dist[sen->mgau[s]], topn);
	    if (best > senscr[s]) {
		best = senscr[s];
	    }
	}

	/* Normalize senone scores */
	for (s = 0; (uint32)s < sen->n_sen; s++) {
	    int32 bs = senscr[s] - best;
	    if (bs > 32767)
		bs = 32767;
	    if (bs < -32768)
		bs = -32768;
	    senscr[s] = bs;
	}
    }
    else {
	int32 i, n;
	/* Flag all active mixture-gaussian codebooks */
	for (gid = 0; gid < g->n_mgau; gid++)
	    msg->mgau_active[gid] = 0;

	n = 0;
	for (i = 0; i < n_senone_active; i++) {
	    /* senone_active consists of deltas. */
	    int32 s = senone_active[i] + n;
	    msg->mgau_active[sen->mgau[s]] = 1;
	    n = s;
	}

	/* Compute topn gaussian density values (for active codebooks) */
	for (gid = 0; gid < g->n_mgau; gid++) {
	    if (msg->mgau_active[gid])
		gauden_dist(g, gid, topn, feat, msg->dist[gid]);
	}

	best = MAX_INT32;
	n = 0;
	for (i = 0; i < n_senone_active; i++) {
	    int32 s = senone_active[i] + n;
	    senscr[s] = senone_eval(sen, s, msg->dist[sen->mgau[s]], topn);
	    if (best > senscr[s]) {
		best = senscr[s];
	    }
	    n = s;
	}

	/* Normalize senone scores */
	n = 0;
	for (i = 0; i < n_senone_active; i++) {
	    int32 s = senone_active[i] + n;
	    int32 bs = senscr[s] - best;
	    if (bs > 32767)
		bs = 32767;
	    if (bs < -32768)
		bs = -32768;
	    senscr[s] = bs;
	    n = s;
	}
    }

    return 0;
}